

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

bool __thiscall UniValue::setNumStr(UniValue *this,string *val_)

{
  char *raw;
  jtokentype jVar1;
  string tokenVal;
  uint local_44;
  string local_40;
  
  raw = (val_->_M_dataplus)._M_p;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  jVar1 = getJsonToken(&local_40,&local_44,raw,raw + val_->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (jVar1 == JTOK_NUMBER) {
    clear(this);
    this->typ = VNUM;
    std::__cxx11::string::_M_assign((string *)&this->val);
  }
  return jVar1 == JTOK_NUMBER;
}

Assistant:

bool UniValue::setNumStr(const std::string& val_)
{
    if (!validNumStr(val_))
        return false;

    clear();
    typ = VNUM;
    val = val_;
    return true;
}